

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_is_opening_code_fence(MD_CTX *ctx,MD_OFFSET beg,MD_OFFSET *p_end)

{
  bool bVar1;
  MD_OFFSET off;
  MD_OFFSET *p_end_local;
  MD_OFFSET beg_local;
  MD_CTX *ctx_local;
  
  off = beg;
  while( true ) {
    bVar1 = false;
    if (off < ctx->size) {
      bVar1 = ctx->text[off] == ctx->text[beg];
    }
    if (!bVar1) break;
    off = off + 1;
  }
  if (2 < off - beg) {
    ctx->code_fence_length = off - beg;
    while( true ) {
      bVar1 = false;
      if (off < ctx->size) {
        bVar1 = ctx->text[off] == ' ';
      }
      if (!bVar1) break;
      off = off + 1;
    }
    while( true ) {
      bVar1 = false;
      if (off < ctx->size) {
        bVar1 = true;
        if (ctx->text[off] != '\r') {
          bVar1 = ctx->text[off] == '\n';
        }
        bVar1 = (bool)(bVar1 ^ 1);
      }
      if (!bVar1) {
        *p_end = off;
        return 1;
      }
      if ((ctx->text[beg] == '`') && (ctx->text[off] == '`')) break;
      off = off + 1;
    }
  }
  return 0;
}

Assistant:

static int
md_is_opening_code_fence(MD_CTX* ctx, OFF beg, OFF* p_end)
{
    OFF off = beg;

    while(off < ctx->size && CH(off) == CH(beg))
        off++;

    /* Fence must have at least three characters. */
    if(off - beg < 3)
        return FALSE;

    ctx->code_fence_length = off - beg;

    /* Optionally, space(s) can follow. */
    while(off < ctx->size  &&  CH(off) == _T(' '))
        off++;

    /* Optionally, an info string can follow. */
    while(off < ctx->size  &&  !ISNEWLINE(off)) {
        /* Backtick-based fence must not contain '`' in the info string. */
        if(CH(beg) == _T('`')  &&  CH(off) == _T('`'))
            return FALSE;
        off++;
    }

    *p_end = off;
    return TRUE;
}